

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall
GEO::PeriodicDelaunay3dThread::show_tet_adjacent
          (PeriodicDelaunay3dThread *this,index_t t,index_t lf)

{
  uint uVar1;
  char cVar2;
  
  uVar1 = (this->cell_to_cell_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
          super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
          super__Vector_impl_data._M_start[lf + t * 4];
  if ((ulong)uVar1 != 0xffffffff) {
    cVar2 = '*';
    if ((this->cell_next_->
        super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
        super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
        super__Vector_impl_data._M_start[uVar1] == 0xfffffffe) {
      cVar2 = ' ';
    }
    std::operator<<((ostream *)&std::cerr,cVar2);
  }
  std::ostream::operator<<(&std::cerr,uVar1);
  std::operator<<((ostream *)&std::cerr,' ');
  return;
}

Assistant:

void show_tet_adjacent(index_t t, index_t lf) const {
            signed_index_t adj = tet_adjacent(t, lf);
            if(adj != -1) {
                std::cerr << (tet_is_in_list(index_t(adj)) ? '*' : ' ');
            }
            std::cerr << adj;
            std::cerr << ' ';
        }